

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O1

bool __thiscall
sparse_square_matrix<bool>::get(sparse_square_matrix<bool> *this,uint32_t i,uint32_t j)

{
  _Bit_type *p_Var1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  uint uVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  undefined1 uVar9;
  
  uVar5 = this->N;
  if (uVar5 <= i) {
    __assert_fail("i < N",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x39,
                  "const Ty sparse_square_matrix<bool>::get(uint32_t, uint32_t) const [Ty = bool]");
  }
  if (uVar5 <= j) {
    __assert_fail("j < N",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x3a,
                  "const Ty sparse_square_matrix<bool>::get(uint32_t, uint32_t) const [Ty = bool]");
  }
  p_Var1 = (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if ((p_Var1 == (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
     ((this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
    p_Var4 = (_Hash_node_base *)(ulong)(uVar5 * i + j);
    uVar2 = (this->sparseStorage)._M_h._M_bucket_count;
    uVar6 = (ulong)p_Var4 % uVar2;
    p_Var7 = (this->sparseStorage)._M_h._M_buckets[uVar6];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var7->_M_nxt, p_Var8 = p_Var7, p_Var7->_M_nxt[1]._M_nxt != p_Var4)) {
      while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar6) ||
           (p_Var8 = p_Var7, p_Var3[1]._M_nxt == p_Var4)) goto LAB_007eed50;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_007eed50:
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var8->_M_nxt;
    }
    if (p_Var4 == (_Hash_node_base *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(undefined1 *)&p_Var4[2]._M_nxt;
    }
  }
  else {
    uVar5 = uVar5 * i + j;
    uVar9 = (p_Var1[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0;
  }
  return (bool)uVar9;
}

Assistant:

const Ty get(uint32_t i, uint32_t j) const {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      return denseStorage[i * N + j];
    }
    auto iter = sparseStorage.find(i * N + j);
    return iter == sparseStorage.end() ? Ty() : iter->second;
  }